

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O2

void __thiscall
helics::CallbackFederate::CallbackFederate
          (CallbackFederate *this,string_view fedName,shared_ptr<helics::Core> *core,
          FederateInfo *fedInfo)

{
  Federate::Federate((Federate *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98,
                     fedName,core,fedInfo);
  helics::CombinationFederate::CombinationFederate
            (&this->super_CombinationFederate,&PTR_construction_vtable_24__004bcce8,fedName,core,
             fedInfo);
  (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate = (_func_int **)0x4bcb38
  ;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98 = 0x4bcc60;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x10 = 0x4bcb98;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x20 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x38 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x40 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x48 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x50 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x60 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x70 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x80 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x90 = 0;
  loadOperator(this);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(std::string_view fedName,
                                   const std::shared_ptr<Core>& core,
                                   const FederateInfo& fedInfo):
    Federate(fedName, core, fedInfo), CombinationFederate(fedName, core, fedInfo)
{
    loadOperator();
}